

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

void __thiscall
CorUnix::CPalSynchronizationManager::DiscardMonitoredProcesses
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent)

{
  MonitoredProcessesListNode *pvMem;
  
  InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  while (pvMem = this->m_pmplnMonitoredProcesses, pvMem != (MonitoredProcessesListNode *)0x0) {
    this->m_pmplnMonitoredProcesses = pvMem->pNext;
    CSynchData::Release(pvMem->psdSynchData,pthrCurrent);
    InternalFree(pvMem);
  }
  InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  return;
}

Assistant:

void CPalSynchronizationManager::DiscardMonitoredProcesses(
        CPalThread * pthrCurrent)
    {
        MonitoredProcessesListNode * pNode;

        // Grab the monitored processes lock
        InternalEnterCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);

        while (m_pmplnMonitoredProcesses)
        {
            pNode = m_pmplnMonitoredProcesses;
            m_pmplnMonitoredProcesses = pNode->pNext;
            pNode->psdSynchData->Release(pthrCurrent);
            InternalDelete(pNode);
        }

        // Release the monitored processes lock
        InternalLeaveCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
    }